

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfogatherer.cpp
# Opt level: O3

void __thiscall
QFileInfoGatherer::fetch
          (QFileInfoGatherer *this,QFileInfo *fileInfo,QElapsedTimer *base,bool *firstTime,
          QList<std::pair<QString,_QFileInfo>_> *updatedFiles,QString *path)

{
  long lVar1;
  long in_FS_OFFSET;
  QArrayData *local_78;
  QString *pQStack_70;
  QList<std::pair<QString,_QFileInfo>_> *local_68;
  pair<QString,_QFileInfo> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QFileInfo::fileName();
  local_58.first.d.d = (Data *)local_78;
  local_58.first.d.ptr = (char16_t *)pQStack_70;
  local_58.first.d.size = (qsizetype)local_68;
  QFileInfo::QFileInfo(&local_58.second,fileInfo);
  QtPrivate::QMovableArrayOps<std::pair<QString,QFileInfo>>::emplace<std::pair<QString,QFileInfo>>
            ((QMovableArrayOps<std::pair<QString,QFileInfo>> *)updatedFiles,(updatedFiles->d).size,
             &local_58);
  QList<std::pair<QString,_QFileInfo>_>::end(updatedFiles);
  QFileInfo::~QFileInfo(&local_58.second);
  if (&(local_58.first.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.first.d.d)->super_QArrayData,2,0x10);
    }
  }
  QElapsedTimer::start();
  if (((*firstTime == true) && (100 < (ulong)(updatedFiles->d).size)) ||
     (lVar1 = QElapsedTimer::msecsTo(base), 1000 < lVar1)) {
    local_58.first.d.d = (Data *)0x0;
    local_58.first.d.ptr = (char16_t *)path;
    local_58.first.d.size = (qsizetype)updatedFiles;
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)&local_58);
    QList<std::pair<QString,_QFileInfo>_>::clear(updatedFiles);
    *(undefined4 *)&base->t1 = 0;
    *(undefined4 *)((long)&base->t1 + 4) = 0x80000000;
    *(undefined4 *)&base->t2 = 0;
    *(undefined4 *)((long)&base->t2 + 4) = 0x80000000;
    *firstTime = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileInfoGatherer::fetch(const QFileInfo &fileInfo, QElapsedTimer &base, bool &firstTime,
                              QList<std::pair<QString, QFileInfo>> &updatedFiles, const QString &path)
{
    updatedFiles.emplace_back(std::pair(fileInfo.fileName(), fileInfo));
    QElapsedTimer current;
    current.start();
    if ((firstTime && updatedFiles.size() > 100) || base.msecsTo(current) > 1000) {
        emit updates(path, updatedFiles);
        updatedFiles.clear();
        base = current;
        firstTime = false;
    }
}